

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O2

QStyleSheetStyle * __thiscall
QStyleSheetStyle::standardPixmap
          (QStyleSheetStyle *this,StandardPixmap standardPixmap,QStyleOption *opt,QWidget *w)

{
  QStyleSheetStyle *pQVar1;
  bool bVar2;
  QStyle *pQVar3;
  undefined4 in_register_00000034;
  QStyleSheetStyle *this_00;
  QObject *in_R8;
  long in_FS_OFFSET;
  double dVar4;
  QLatin1StringView sh;
  undefined8 local_e8;
  QIcon icon;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  long local_38;
  
  pQVar1 = globalStyleSheetStyle;
  this_00 = (QStyleSheetStyle *)CONCAT44(in_register_00000034,standardPixmap);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (globalStyleSheetStyle != this_00 && globalStyleSheetStyle != (QStyleSheetStyle *)0x0) {
    pQVar3 = baseStyle((QStyleSheetStyle *)this_00);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      (**(code **)(*(long *)pQVar3 + 0xf8))(this,pQVar3,(ulong)opt & 0xffffffff,w);
      return this;
    }
    goto LAB_0034f5d4;
  }
  if (globalStyleSheetStyle == (QStyleSheetStyle *)0x0) {
    globalStyleSheetStyle = this_00;
  }
  sh = propertyNameForStandardPixmap((StandardPixmap)opt);
  if (sh.m_size == 0) {
LAB_0034f534:
    pQVar3 = baseStyle((QStyleSheetStyle *)this_00);
    (**(code **)(*(long *)pQVar3 + 0xf8))(this,pQVar3,(ulong)opt & 0xffffffff,w,in_R8);
  }
  else {
    local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    renderRule((QRenderRule *)&icon,(QStyleSheetStyle *)this_00,in_R8,(QStyleOption *)w,0);
    QRenderRule::styleHint((QVariant *)&local_58,(QRenderRule *)&icon,sh);
    QRenderRule::~QRenderRule((QRenderRule *)&icon);
    if ((puStack_40 < (undefined1 *)0x4) ||
       (bVar2 = ::QVariant::canConvert<QIcon>((QVariant *)&local_58), !bVar2)) {
      ::QVariant::~QVariant((QVariant *)&local_58);
      goto LAB_0034f534;
    }
    icon.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    qvariant_cast<QIcon>((QVariant *)&icon);
    local_e8 = 0x1000000010;
    if (in_R8 == (QObject *)0x0) {
      dVar4 = (double)QGuiApplication::devicePixelRatio();
    }
    else {
      dVar4 = (double)QPaintDevice::devicePixelRatio();
    }
    QIcon::pixmap((QSize *)this,dVar4,(Mode)&icon,(State)&local_e8);
    QIcon::~QIcon(&icon);
    ::QVariant::~QVariant((QVariant *)&local_58);
  }
  if (pQVar1 == (QStyleSheetStyle *)0x0) {
    globalStyleSheetStyle = (QStyleSheetStyle *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
LAB_0034f5d4:
  __stack_chk_fail();
}

Assistant:

QPixmap QStyleSheetStyle::standardPixmap(StandardPixmap standardPixmap, const QStyleOption *opt,
                                         const QWidget *w) const
{
    RECURSION_GUARD(return baseStyle()->standardPixmap(standardPixmap, opt, w))
    const auto s = propertyNameForStandardPixmap(standardPixmap);
    if (!s.isEmpty()) {
        const auto styleHint = renderRule(w, opt).styleHint(s);
        if (styleHint.isValid() && styleHint.canConvert<QIcon>()) {
            QIcon icon = qvariant_cast<QIcon>(styleHint);
            return icon.pixmap(QSize(16, 16), QStyleHelper::getDpr(w));
        }
    }
    return baseStyle()->standardPixmap(standardPixmap, opt, w);
}